

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O3

int NV12ToRGB24Matrix(uint8_t *src_y,int src_stride_y,uint8_t *src_uv,int src_stride_uv,
                     uint8_t *dst_rgb24,int dst_stride_rgb24,YuvConstants *yuvconstants,int width,
                     int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  uint local_54;
  
  iVar1 = -1;
  if (height != 0 &&
      (0 < width &&
      (dst_rgb24 != (uint8_t *)0x0 && (src_uv != (uint8_t *)0x0 && src_y != (uint8_t *)0x0)))) {
    if (height < 0) {
      local_54 = -height;
      dst_rgb24 = dst_rgb24 + ~height * dst_stride_rgb24;
      dst_stride_rgb24 = -dst_stride_rgb24;
    }
    else {
      local_54 = height;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar4 = NV12ToRGB24Row_SSSE3;
    }
    else {
      pcVar4 = NV12ToRGB24Row_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar4 = NV12ToRGB24Row_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0x1fU) == 0) {
      pcVar3 = NV12ToRGB24Row_AVX2;
    }
    else {
      pcVar3 = NV12ToRGB24Row_Any_AVX2;
    }
    if ((uVar2 >> 10 & 1) == 0) {
      pcVar3 = pcVar4;
    }
    uVar2 = 0;
    do {
      (*pcVar3)(src_y,src_uv,dst_rgb24,yuvconstants,width);
      dst_rgb24 = dst_rgb24 + dst_stride_rgb24;
      src_y = src_y + src_stride_y;
      src_uv = src_uv + (int)(-(uVar2 & 1) & src_stride_uv);
      uVar2 = uVar2 + 1;
    } while (local_54 != uVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int NV12ToRGB24Matrix(const uint8_t* src_y,
                      int src_stride_y,
                      const uint8_t* src_uv,
                      int src_stride_uv,
                      uint8_t* dst_rgb24,
                      int dst_stride_rgb24,
                      const struct YuvConstants* yuvconstants,
                      int width,
                      int height) {
  int y;
  void (*NV12ToRGB24Row)(
      const uint8_t* y_buf, const uint8_t* uv_buf, uint8_t* rgb_buf,
      const struct YuvConstants* yuvconstants, int width) = NV12ToRGB24Row_C;
  if (!src_y || !src_uv || !dst_rgb24 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgb24 = dst_rgb24 + (height - 1) * dst_stride_rgb24;
    dst_stride_rgb24 = -dst_stride_rgb24;
  }
#if defined(HAS_NV12TORGB24ROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    NV12ToRGB24Row = NV12ToRGB24Row_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      NV12ToRGB24Row = NV12ToRGB24Row_NEON;
    }
  }
#endif
#if defined(HAS_NV12TORGB24ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    NV12ToRGB24Row = NV12ToRGB24Row_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      NV12ToRGB24Row = NV12ToRGB24Row_SSSE3;
    }
  }
#endif
#if defined(HAS_NV12TORGB24ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    NV12ToRGB24Row = NV12ToRGB24Row_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      NV12ToRGB24Row = NV12ToRGB24Row_AVX2;
    }
  }
#endif
#if defined(HAS_NV12TORGB24ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    NV12ToRGB24Row = NV12ToRGB24Row_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      NV12ToRGB24Row = NV12ToRGB24Row_MMI;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    NV12ToRGB24Row(src_y, src_uv, dst_rgb24, yuvconstants, width);
    dst_rgb24 += dst_stride_rgb24;
    src_y += src_stride_y;
    if (y & 1) {
      src_uv += src_stride_uv;
    }
  }
  return 0;
}